

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall
QPDFWriter::setEncryptionParametersInternal
          (QPDFWriter *this,int V,int R,int key_len,int P,string *O,string *U,string *OE,string *UE,
          string *Perms,string *id1,string *user_password,string *encryption_key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  element_type *peVar3;
  pointer pcVar4;
  mapped_type *pmVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  undefined4 in_register_0000000c;
  EncryptionData *data;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  key_type local_280;
  key_type local_260;
  uint local_240;
  uint local_23c;
  EncryptionData encryption_data;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  data = (EncryptionData *)CONCAT44(in_register_0000000c,key_len);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar3->encryption_V = V;
  peVar3->encryption_R = R;
  local_23c = P;
  encryption_data._0_8_ = &encryption_data.O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"/Filter","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar3->encryption_dictionary,(key_type *)&encryption_data);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x27e7a6);
  if ((string *)encryption_data._0_8_ != &encryption_data.O) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  uVar15 = -V;
  if (0 < V) {
    uVar15 = V;
  }
  uVar16 = 1;
  if (9 < uVar15) {
    uVar12 = (ulong)uVar15;
    uVar17 = 4;
    do {
      uVar16 = uVar17;
      uVar8 = (uint)uVar12;
      if (uVar8 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_001e771f;
      }
      if (uVar8 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_001e771f;
      }
      if (uVar8 < 10000) goto LAB_001e771f;
      uVar12 = uVar12 / 10000;
      uVar17 = uVar16 + 4;
    } while (99999 < uVar8);
    uVar16 = uVar16 + 1;
  }
LAB_001e771f:
  encryption_data._0_8_ = &encryption_data.O;
  local_240 = R;
  std::__cxx11::string::_M_construct((ulong)&encryption_data,(char)uVar16 - (char)(V >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)V >> 0x1f) + encryption_data._0_8_),uVar16,uVar15);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"/V","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar3->encryption_dictionary,&local_280);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&encryption_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != &encryption_data.O) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  uVar16 = key_len * 8;
  uVar15 = key_len * -8;
  if (key_len * -8 < 0) {
    uVar15 = uVar16;
  }
  uVar17 = 1;
  if (9 < uVar15) {
    uVar12 = (ulong)uVar15;
    uVar8 = 4;
    do {
      uVar17 = uVar8;
      uVar9 = (uint)uVar12;
      if (uVar9 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_001e783d;
      }
      if (uVar9 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_001e783d;
      }
      if (uVar9 < 10000) goto LAB_001e783d;
      uVar12 = uVar12 / 10000;
      uVar8 = uVar17 + 4;
    } while (99999 < uVar9);
    uVar17 = uVar17 + 1;
  }
LAB_001e783d:
  encryption_data._0_8_ = &encryption_data.O;
  std::__cxx11::string::_M_construct
            ((ulong)&encryption_data,(char)uVar17 - (char)((int)uVar16 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar16 >> 0x1f) + encryption_data._0_8_),uVar17,uVar15);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"/Length","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar3->encryption_dictionary,&local_280);
  uVar15 = local_240;
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&encryption_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != &encryption_data.O) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  uVar16 = -uVar15;
  if (0 < (int)uVar15) {
    uVar16 = uVar15;
  }
  uVar17 = 1;
  if (9 < uVar16) {
    uVar12 = (ulong)uVar16;
    uVar8 = 4;
    do {
      uVar17 = uVar8;
      uVar9 = (uint)uVar12;
      if (uVar9 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_001e7947;
      }
      if (uVar9 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_001e7947;
      }
      if (uVar9 < 10000) goto LAB_001e7947;
      uVar12 = uVar12 / 10000;
      uVar8 = uVar17 + 4;
    } while (99999 < uVar9);
    uVar17 = uVar17 + 1;
  }
LAB_001e7947:
  encryption_data._0_8_ = &encryption_data.O;
  std::__cxx11::string::_M_construct
            ((ulong)&encryption_data,(char)uVar17 - (char)((int)uVar15 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar15 >> 0x1f) + encryption_data._0_8_),uVar17,uVar16);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"/R","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar3->encryption_dictionary,&local_280);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&encryption_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != &encryption_data.O) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  uVar15 = -local_23c;
  if (0 < (int)local_23c) {
    uVar15 = local_23c;
  }
  uVar16 = 1;
  if (9 < uVar15) {
    uVar12 = (ulong)uVar15;
    uVar17 = 4;
    do {
      uVar16 = uVar17;
      uVar8 = (uint)uVar12;
      if (uVar8 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_001e7a51;
      }
      if (uVar8 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_001e7a51;
      }
      if (uVar8 < 10000) goto LAB_001e7a51;
      uVar12 = uVar12 / 10000;
      uVar17 = uVar16 + 4;
    } while (99999 < uVar8);
    uVar16 = uVar16 + 1;
  }
LAB_001e7a51:
  uVar17 = local_23c >> 0x1f;
  encryption_data._0_8_ = &encryption_data.O;
  std::__cxx11::string::_M_construct
            ((ulong)&encryption_data,(char)uVar16 - (char)((int)local_23c >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)uVar17 + encryption_data._0_8_),uVar16,uVar15);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_280.field_2;
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"/P","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar3->encryption_dictionary,&local_280);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&encryption_data);
  psVar2 = &encryption_data.O;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != psVar2) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  pcVar4 = (O->_M_dataplus)._M_p;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar4,pcVar4 + O->_M_string_length)
  ;
  if (local_90 == &local_80) {
    local_280.field_2._8_8_ = local_80._8_8_;
    local_280._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_280._M_dataplus._M_p = (pointer)local_90;
  }
  local_280.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
  local_280.field_2._M_local_buf[0] = local_80._M_local_buf[0];
  local_280._M_string_length = local_88;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_90 = &local_80;
  QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_280,true);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_260.field_2;
  local_260._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/O","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar3->encryption_dictionary,&local_260);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&encryption_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar1) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != psVar2) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0])
                             + 1);
  }
  pcVar4 = (U->_M_dataplus)._M_p;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar4,pcVar4 + U->_M_string_length)
  ;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  if (local_b0 == &local_a0) {
    local_280.field_2._8_8_ = local_a0._8_8_;
  }
  else {
    local_280._M_dataplus._M_p = (pointer)local_b0;
  }
  local_280.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_280.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
  local_280._M_string_length = local_a8;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_b0 = &local_a0;
  QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_280,true);
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_260._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/U","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar3->encryption_dictionary,&local_260);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&encryption_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar1) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != psVar2) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0])
                             + 1);
  }
  if (4 < V) {
    pcVar4 = (OE->_M_dataplus)._M_p;
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar4,pcVar4 + OE->_M_string_length);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    if (local_d0 == &local_c0) {
      local_280.field_2._8_8_ = local_c0._8_8_;
    }
    else {
      local_280._M_dataplus._M_p = (pointer)local_d0;
    }
    local_280.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
    local_280.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
    local_280._M_string_length = local_c8;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_d0 = &local_c0;
    QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_280,true);
    peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/OE","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar3->encryption_dictionary,&local_260);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&encryption_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((string *)encryption_data._0_8_ != psVar2) {
      operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,
                                        local_c0._M_local_buf[0]) + 1);
    }
    pcVar4 = (UE->_M_dataplus)._M_p;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar4,pcVar4 + UE->_M_string_length);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    if (local_f0 == &local_e0) {
      local_280.field_2._8_8_ = local_e0._8_8_;
    }
    else {
      local_280._M_dataplus._M_p = (pointer)local_f0;
    }
    local_280.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
    local_280.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
    local_280._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_f0 = &local_e0;
    QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_280,true);
    peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/UE","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar3->encryption_dictionary,&local_260);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&encryption_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((string *)encryption_data._0_8_ != psVar2) {
      operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                        local_e0._M_local_buf[0]) + 1);
    }
    pcVar4 = (Perms->_M_dataplus)._M_p;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar4,pcVar4 + Perms->_M_string_length);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    if (local_110 == &local_100) {
      local_280.field_2._8_8_ = local_100._8_8_;
    }
    else {
      local_280._M_dataplus._M_p = (pointer)local_110;
    }
    local_280.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
    local_280.field_2._M_local_buf[0] = local_100._M_local_buf[0];
    local_280._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_110 = &local_100;
    QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_280,true);
    peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/Perms","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar3->encryption_dictionary,&local_260);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&encryption_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((string *)encryption_data._0_8_ != psVar2) {
      operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,
                      CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1)
      ;
    }
  }
  uVar15 = local_240;
  encryption_data._0_8_ = psVar2;
  if ((int)local_240 < 6) {
    if (local_240 == 3) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"1.4","");
      setMinimumPDFVersion(this,(string *)&encryption_data,0);
    }
    else if (local_240 == 4) {
      pcVar13 = "1.5";
      bVar18 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->encrypt_use_aes != false;
      if (bVar18) {
        pcVar13 = "1.6";
      }
      pcVar14 = "1.5";
      if (bVar18) {
        pcVar14 = "1.6";
      }
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&encryption_data,pcVar13,pcVar14 + 3);
      setMinimumPDFVersion(this,(string *)&encryption_data,0);
    }
    else if (local_240 == 5) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"1.7","");
      setMinimumPDFVersion(this,(string *)&encryption_data,3);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"1.3","");
      setMinimumPDFVersion(this,(string *)&encryption_data,0);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"1.7","");
    setMinimumPDFVersion(this,(string *)&encryption_data,8);
  }
  if ((string *)encryption_data._0_8_ != psVar2) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  if ((3 < (int)uVar15) &&
     (peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar3->encrypt_metadata == false)) {
    encryption_data._0_8_ = psVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&encryption_data,"/EncryptMetadata","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar3->encryption_dictionary,(key_type *)&encryption_data);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x27cc38);
    if ((string *)encryption_data._0_8_ != psVar2) {
      operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1))
      ;
    }
  }
  if ((V & 0xfffffffeU) != 4) goto LAB_001e86fc;
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  encryption_data._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"/StmF","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar3->encryption_dictionary,(key_type *)&encryption_data);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x27e7bc);
  if ((string *)encryption_data._0_8_ != psVar2) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  encryption_data._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"/StrF","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar3->encryption_dictionary,(key_type *)&encryption_data);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x27e7bc);
  if ((string *)encryption_data._0_8_ != psVar2) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  uVar12 = (ulong)((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->encrypt_use_aes;
  pcVar13 = "/AESV3";
  if (V < 5) {
    pcVar13 = "/AESV2";
  }
  pcVar14 = "/V2";
  if (uVar12 != 0) {
    pcVar14 = pcVar13;
  }
  encryption_data._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&encryption_data,pcVar14,pcVar14 + uVar12 * 3 + 3);
  std::operator+(&local_50,"<< /StdCF << /AuthEvent /DocOpen /CFM ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &encryption_data);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_140 = *puVar10;
    uStack_138 = (undefined4)plVar6[3];
    uStack_134 = *(undefined4 *)((long)plVar6 + 0x1c);
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar10;
    local_150 = (ulong *)*plVar6;
  }
  local_148 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar13 = "32";
  if (V < 5) {
    pcVar13 = "16";
  }
  pcVar14 = "";
  if (V < 5) {
    pcVar14 = "";
  }
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,pcVar13,pcVar14);
  uVar12 = 0xf;
  if (local_150 != &local_140) {
    uVar12 = local_140;
  }
  if (uVar12 < (ulong)(local_128 + local_148)) {
    uVar12 = 0xf;
    if (local_130 != local_120) {
      uVar12 = local_120[0];
    }
    if (uVar12 < (ulong)(local_128 + local_148)) goto LAB_001e8471;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_001e8471:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130);
  }
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  psVar11 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_260.field_2._M_allocated_capacity = *psVar11;
    local_260.field_2._8_8_ = puVar7[3];
  }
  else {
    local_260.field_2._M_allocated_capacity = *psVar11;
    local_260._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_260._M_string_length = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_260);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_280.field_2._M_allocated_capacity = *psVar11;
    local_280.field_2._8_8_ = plVar6[3];
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar11;
    local_280._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_280._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/CF","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar3->encryption_dictionary,&local_70);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar15 = local_240;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != &encryption_data.O) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
LAB_001e86fc:
  peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar3->encrypted = true;
  QPDF::EncryptionData::EncryptionData
            (&encryption_data,V,uVar15,key_len,local_23c,O,U,OE,UE,Perms,id1,
             peVar3->encrypt_metadata);
  if (V < 5) {
    QPDF::compute_encryption_key(&local_280,(QPDF *)user_password,(string *)&encryption_data,data);
    std::__cxx11::string::operator=
              ((string *)
               &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->encryption_key,(string *)&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign
              ((string *)
               &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->encryption_key);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.id1._M_dataplus._M_p != &encryption_data.id1.field_2) {
    operator_delete(encryption_data.id1._M_dataplus._M_p,
                    encryption_data.id1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.Perms._M_dataplus._M_p != &encryption_data.Perms.field_2) {
    operator_delete(encryption_data.Perms._M_dataplus._M_p,
                    encryption_data.Perms.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.UE._M_dataplus._M_p != &encryption_data.UE.field_2) {
    operator_delete(encryption_data.UE._M_dataplus._M_p,
                    encryption_data.UE.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.OE._M_dataplus._M_p != &encryption_data.OE.field_2) {
    operator_delete(encryption_data.OE._M_dataplus._M_p,
                    encryption_data.OE.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.U._M_dataplus._M_p != &encryption_data.U.field_2) {
    operator_delete(encryption_data.U._M_dataplus._M_p,
                    encryption_data.U.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.O._M_dataplus._M_p != &encryption_data.O.field_2) {
    operator_delete(encryption_data.O._M_dataplus._M_p,
                    encryption_data.O.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::setEncryptionParametersInternal(
    int V,
    int R,
    int key_len,
    int P,
    std::string const& O,
    std::string const& U,
    std::string const& OE,
    std::string const& UE,
    std::string const& Perms,
    std::string const& id1,
    std::string const& user_password,
    std::string const& encryption_key)
{
    m->encryption_V = V;
    m->encryption_R = R;
    m->encryption_dictionary["/Filter"] = "/Standard";
    m->encryption_dictionary["/V"] = std::to_string(V);
    m->encryption_dictionary["/Length"] = std::to_string(key_len * 8);
    m->encryption_dictionary["/R"] = std::to_string(R);
    m->encryption_dictionary["/P"] = std::to_string(P);
    m->encryption_dictionary["/O"] = QPDF_String(O).unparse(true);
    m->encryption_dictionary["/U"] = QPDF_String(U).unparse(true);
    if (V >= 5) {
        m->encryption_dictionary["/OE"] = QPDF_String(OE).unparse(true);
        m->encryption_dictionary["/UE"] = QPDF_String(UE).unparse(true);
        m->encryption_dictionary["/Perms"] = QPDF_String(Perms).unparse(true);
    }
    if (R >= 6) {
        setMinimumPDFVersion("1.7", 8);
    } else if (R == 5) {
        setMinimumPDFVersion("1.7", 3);
    } else if (R == 4) {
        setMinimumPDFVersion(m->encrypt_use_aes ? "1.6" : "1.5");
    } else if (R == 3) {
        setMinimumPDFVersion("1.4");
    } else {
        setMinimumPDFVersion("1.3");
    }

    if ((R >= 4) && (!m->encrypt_metadata)) {
        m->encryption_dictionary["/EncryptMetadata"] = "false";
    }
    if ((V == 4) || (V == 5)) {
        // The spec says the value for the crypt filter key can be anything, and xpdf seems to
        // agree.  However, Adobe Reader won't open our files unless we use /StdCF.
        m->encryption_dictionary["/StmF"] = "/StdCF";
        m->encryption_dictionary["/StrF"] = "/StdCF";
        std::string method = (m->encrypt_use_aes ? ((V < 5) ? "/AESV2" : "/AESV3") : "/V2");
        // The PDF spec says the /Length key is optional, but the PDF previewer on some versions of
        // MacOS won't open encrypted files without it.
        m->encryption_dictionary["/CF"] = "<< /StdCF << /AuthEvent /DocOpen /CFM " + method +
            " /Length " + std::string((V < 5) ? "16" : "32") + " >> >>";
    }

    m->encrypted = true;
    QPDF::EncryptionData encryption_data(
        V, R, key_len, P, O, U, OE, UE, Perms, id1, m->encrypt_metadata);
    if (V < 5) {
        m->encryption_key = QPDF::compute_encryption_key(user_password, encryption_data);
    } else {
        m->encryption_key = encryption_key;
    }
}